

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O0

string * sago::internal::getHome_abi_cxx11_(void)

{
  __uid_t __uid;
  char *pcVar1;
  size_type sVar2;
  runtime_error *prVar3;
  string *in_RDI;
  char *tempRes;
  undefined1 local_88 [4];
  int error_code;
  vector<char,_std::allocator<char>_> buffer;
  long bufsize;
  passwd pwd;
  passwd *pw;
  char *homeEnv;
  int uid;
  string *res;
  
  std::__cxx11::string::string((string *)in_RDI);
  __uid = getuid();
  pcVar1 = getenv("HOME");
  if ((__uid == 0) || (pcVar1 == (char *)0x0)) {
    pwd.pw_shell = (char *)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = sysconf(0x46);
    if ((long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ < 1) {
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0x4000;
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_88);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_88,
               buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
    pcVar1 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_88);
    sVar2 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_88);
    tempRes._4_4_ = getpwuid_r(__uid,(passwd *)&bufsize,pcVar1,sVar2,(passwd **)&pwd.pw_shell);
    while (tempRes._4_4_ == 0x22) {
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
           buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ * 2;
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)local_88,
                 buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
      pcVar1 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_88);
      sVar2 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_88);
      tempRes._4_4_ = getpwuid_r(__uid,(passwd *)&bufsize,pcVar1,sVar2,(passwd **)&pwd.pw_shell);
    }
    if (tempRes._4_4_ != 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Unable to get passwd struct.");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*(char **)(pwd.pw_shell + 0x20) == (char *)0x0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"User has no home directory");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)in_RDI,*(char **)(pwd.pw_shell + 0x20));
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_88);
  }
  else {
    std::__cxx11::string::operator=((string *)in_RDI,pcVar1);
  }
  return in_RDI;
}

Assistant:

std::string getHome() {
	std::string res;
	int uid = getuid();
	const char* homeEnv = std::getenv("HOME");
	if ( uid != 0 && homeEnv) {
		//We only acknowlegde HOME if not root.
		res = homeEnv;
		return res;
	}
	struct passwd* pw = nullptr;
	struct passwd pwd;
	long bufsize = sysconf(_SC_GETPW_R_SIZE_MAX);
	if (bufsize < 1) {
		bufsize = 16384;
	}
	std::vector<char> buffer;
	buffer.resize(bufsize);
	int error_code = getpwuid_r(uid, &pwd, buffer.data(), buffer.size(), &pw);
	while (error_code == ERANGE) {
		// The buffer was too small. Try again with a larger buffer.
		bufsize *= 2;
		buffer.resize(bufsize);
		error_code = getpwuid_r(uid, &pwd, buffer.data(), buffer.size(), &pw);
	}
	if (error_code) {
		throw std::runtime_error("Unable to get passwd struct.");
	}
	const char* tempRes = pw->pw_dir;
	if (!tempRes) {
		throw std::runtime_error("User has no home directory");
	}
	res = tempRes;
	return res;
}